

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O0

void __thiscall unittest::UnitTest::TestParseGenerate4(UnitTest *this)

{
  char *msg;
  bool result;
  string local_1b8 [48];
  ostringstream local_188 [8];
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> os;
  UnitTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  result = runtest<char>("test4.ini","test4.output",
                         (basic_ostream<char,_std::char_traits<char>_> *)local_188);
  Assert::IsTrue(result);
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  Logger::WriteMessage(msg);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

TEST_METHOD(TestParseGenerate4)
		{
			std::basic_ostringstream<char> os;
			Assert::IsTrue(runtest<char>("test4.ini", "test4.output", os));
			Logger::WriteMessage(os.str().c_str());
		}